

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

void google::protobuf::internal::ExtensionSet::RegisterMessageExtension
               (MessageLite *containing_type,int number,FieldType type,bool is_repeated,
               bool is_packed,MessageLite *prototype)

{
  ExtensionInfo info;
  LogMessage *other;
  LogMessage local_98;
  FieldType local_60;
  undefined1 uStack_5f;
  undefined1 uStack_5e;
  undefined5 uStack_5d;
  MessageLite *pMStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  MessageLite *local_40;
  int local_38;
  LogFinisher local_31;
  
  if ((type & 0xfe) != 10) {
    local_40 = containing_type;
    local_38 = number;
    LogMessage::LogMessage
              (&local_98,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/extension_set.cc"
               ,0xb1);
    other = LogMessage::operator<<
                      (&local_98,
                       "CHECK failed: type == WireFormatLite::TYPE_MESSAGE || type == WireFormatLite::TYPE_GROUP: "
                      );
    LogFinisher::operator=(&local_31,other);
    LogMessage::~LogMessage(&local_98);
    containing_type = local_40;
    number = local_38;
  }
  uStack_48 = 0;
  info.is_repeated = is_repeated;
  info.type = type;
  info.is_packed = is_packed;
  info._3_5_ = uStack_5d;
  info.field_3.enum_validity_check.func = (EnumValidityFuncWithArg *)prototype;
  info.field_3.enum_validity_check.arg = (void *)local_50;
  info.descriptor = (FieldDescriptor *)0x0;
  local_60 = type;
  uStack_5f = is_repeated;
  uStack_5e = is_packed;
  pMStack_58 = prototype;
  anon_unknown_22::Register(containing_type,number,info);
  return;
}

Assistant:

void ExtensionSet::RegisterMessageExtension(const MessageLite* containing_type,
                                            int number, FieldType type,
                                            bool is_repeated, bool is_packed,
                                            const MessageLite* prototype) {
  GOOGLE_CHECK(type == WireFormatLite::TYPE_MESSAGE ||
        type == WireFormatLite::TYPE_GROUP);
  ExtensionInfo info(type, is_repeated, is_packed);
  info.message_info = {prototype};
  Register(containing_type, number, info);
}